

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O1

void do_fmla_zpzzz_h(CPUARMState_conflict *env,void *vg,uint32_t desc,uint16_t neg1,uint16_t neg3)

{
  ulong uVar1;
  float16 fVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar4 = (ulong)((desc & 0x1f) * 8 + 8);
  do {
    uVar1 = *(ulong *)((long)vg + ((long)(uVar4 - 1) >> 6) * 8);
    do {
      uVar3 = (int)uVar4 - 2;
      if ((uVar1 >> ((ulong)uVar3 & 0x3f) & 1) != 0) {
        fVar2 = float16_muladd_aarch64
                          (*(ushort *)
                            ((long)(env->vfp).zregs[0].d + uVar4 + (desc >> 7 & 0x1f00) + -2) ^ neg1
                           ,*(float16 *)
                             ((long)(env->vfp).zregs[0].d + uVar4 + (desc >> 0xc & 0x1f00) + -2),
                           *(ushort *)
                            ((long)(env->vfp).zregs[0].d + uVar4 + (desc >> 0x11 & 0x1f00) + -2) ^
                           neg3,0,&(env->vfp).fp_status_f16);
        *(float16 *)((long)(env->vfp).zregs[0].d + uVar4 + (desc >> 2 & 0x1f00) + -2) = fVar2;
      }
      uVar4 = uVar4 - 2;
    } while ((uVar3 & 0x3f) != 0);
  } while (uVar4 != 0);
  return;
}

Assistant:

static void do_fmla_zpzzz_h(CPUARMState *env, void *vg, uint32_t desc,
                            uint16_t neg1, uint16_t neg3)
{
    intptr_t i = simd_oprsz(desc);
    unsigned rd = extract32(desc, SIMD_DATA_SHIFT, 5);
    unsigned rn = extract32(desc, SIMD_DATA_SHIFT + 5, 5);
    unsigned rm = extract32(desc, SIMD_DATA_SHIFT + 10, 5);
    unsigned ra = extract32(desc, SIMD_DATA_SHIFT + 15, 5);
    void *vd = &env->vfp.zregs[rd];
    void *vn = &env->vfp.zregs[rn];
    void *vm = &env->vfp.zregs[rm];
    void *va = &env->vfp.zregs[ra];
    uint64_t *g = vg;

    do {
        uint64_t pg = g[(i - 1) >> 6];
        do {
            i -= 2;
            if (likely((pg >> (i & 63)) & 1)) {
                float16 e1, e2, e3, r;

                e1 = *(uint16_t *)((char *)vn + H1_2(i)) ^ neg1;
                e2 = *(uint16_t *)((char *)vm + H1_2(i));
                e3 = *(uint16_t *)((char *)va + H1_2(i)) ^ neg3;
                r = float16_muladd(e1, e2, e3, 0, &env->vfp.fp_status_f16);
                *(uint16_t *)((char *)vd + H1_2(i)) = r;
            }
        } while (i & 63);
    } while (i != 0);
}